

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_ext_gstate.c
# Opt level: O1

HPDF_Dict HPDF_ExtGState_New(HPDF_MMgr mmgr,HPDF_Xref xref)

{
  byte *pbVar1;
  HPDF_Dict dict;
  HPDF_STATUS HVar2;
  
  dict = HPDF_Dict_New(mmgr);
  if (((dict != (HPDF_Dict)0x0) && (HVar2 = HPDF_Xref_Add(xref,dict), HVar2 == 0)) &&
     (HVar2 = HPDF_Dict_AddName(dict,"Type","ExtGState"), HVar2 == 0)) {
    pbVar1 = (byte *)((long)&(dict->header).obj_class + 1);
    *pbVar1 = *pbVar1 | 10;
    return dict;
  }
  return (HPDF_Dict)0x0;
}

Assistant:

HPDF_Dict
HPDF_ExtGState_New  (HPDF_MMgr   mmgr, 
                     HPDF_Xref   xref)
{
    HPDF_Dict obj = HPDF_Dict_New (mmgr);

    HPDF_PTRACE ((" HPDF_ExtGState_New\n"));

    if (!obj)
        return NULL;

    if (HPDF_Xref_Add (xref, obj) != HPDF_OK)
        return NULL;

    if (HPDF_Dict_AddName (obj, "Type", "ExtGState") != HPDF_OK)
        return NULL;

    obj->header.obj_class |= HPDF_OSUBCLASS_EXT_GSTATE;

    return obj;
}